

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gz_creation.c
# Opt level: O2

int test_gz_creation(void)

{
  uint __line;
  int iVar1;
  size_t buff_size;
  void *pvVar2;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  Elf64_Ehdr *size;
  long lVar6;
  size_t compr_size;
  size_t decompr_size;
  char *strings [8];
  
  strings[0] = anon_var_dwarf_10b;
  strings[1] = "a";
  strings[2] = "Hello world";
  strings[3] = anon_var_dwarf_16b;
  strings[4] = 
  "Lorem Ipsum is simply dummy text of the printing and typesetting industry. Lorem Ipsum has been the industry\'s standard dummy text ever since the 1500s, when an unknown printer took a galley of type and scrambled it to make a type specimen book. It has survived not only five centuries, but also the leap into electronic typesetting, remaining essentially unchanged. It was popularised in the 1960s with the release of Letraset sheets containing Lorem Ipsum passages, and more recently with desktop publishing software like Aldus PageMaker including versions of Lorem Ipsum"
  ;
  strings[5] = anon_var_dwarf_1a8;
  strings[6] = anon_var_dwarf_1c7;
  strings[7] = anon_var_dwarf_1e6;
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    pcVar5 = strings[lVar6];
    buff_size = strlen(pcVar5);
    if (buff_size == 0) {
      pcVar3 = "src_string_len > 0";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 0x49;
      goto LAB_001016a9;
    }
    compr_size = 0;
    pvVar2 = nhr_gz_compress(pcVar5,buff_size,&compr_size,'\0');
    if (pvVar2 == (void *)0x0) {
      pcVar3 = "compr_buff";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 0x4d;
      goto LAB_001016a9;
    }
    if (compr_size == 0) {
      pcVar3 = "compr_size > 0";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 0x4e;
      goto LAB_001016a9;
    }
    decompr_size = 0;
    pcVar3 = (char *)nhr_gz_decompress(pvVar2,compr_size,&decompr_size,'\0');
    if (buff_size != decompr_size) {
      pcVar3 = "src_string_len == decompr_size";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 0x53;
      goto LAB_001016a9;
    }
    iVar1 = strncmp(pcVar5,pcVar3,buff_size);
    if (iVar1 != 0) {
      pcVar3 = "strncmp(src_string, decompr_string, decompr_size) == 0";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 0x54;
      goto LAB_001016a9;
    }
    nhr_free(pvVar2);
    nhr_free(pcVar3);
    compr_size = 0;
    pvVar2 = nhr_gz_compress(pcVar5,buff_size,&compr_size,'\x01');
    if (pvVar2 == (void *)0x0) {
      pcVar3 = "compr_buff";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 0x5c;
      goto LAB_001016a9;
    }
    if (compr_size == 0) {
      pcVar3 = "compr_size > 0";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 0x5d;
      goto LAB_001016a9;
    }
    decompr_size = 0;
    pcVar3 = (char *)nhr_gz_decompress(pvVar2,compr_size,&decompr_size,'\x01');
    if (buff_size != decompr_size) {
      pcVar3 = "src_string_len == decompr_size";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 0x62;
      goto LAB_001016a9;
    }
    iVar1 = strncmp(pcVar5,pcVar3,buff_size);
    if (iVar1 != 0) {
      pcVar3 = "strncmp(src_string, decompr_string, decompr_size) == 0";
      pcVar5 = "int test_gz_creation_string(void)";
      __line = 99;
      goto LAB_001016a9;
    }
    nhr_free(pvVar2);
    nhr_free(pcVar3);
  }
  size = &Elf64_Ehdr_00100000;
  while( true ) {
    if (size == (Elf64_Ehdr *)0xa00000) {
      return 0;
    }
    pvVar2 = nhr_malloc((size_t)size);
    compr_size = 0;
    pvVar4 = nhr_gz_compress(pvVar2,(size_t)size,&compr_size,'\0');
    if (pvVar4 == (void *)0x0) break;
    if (compr_size == 0) {
      pcVar3 = "compr_size > 0";
      pcVar5 = "int test_gz_big_data(void)";
      __line = 0x78;
      goto LAB_001016a9;
    }
    strings[0] = (char *)0x0;
    pvVar4 = nhr_gz_decompress(pvVar4,compr_size,(size_t *)strings,'\0');
    if (size != (Elf64_Ehdr *)strings[0]) {
      pcVar3 = "src_size == dst_size";
      pcVar5 = "int test_gz_big_data(void)";
      __line = 0x7d;
      goto LAB_001016a9;
    }
    iVar1 = bcmp(pvVar2,pvVar4,(size_t)size);
    if (iVar1 != 0) {
      pcVar3 = "memcmp(src, dst, src_size) == 0";
      pcVar5 = "int test_gz_big_data(void)";
      __line = 0x7e;
      goto LAB_001016a9;
    }
    nhr_free(pvVar2);
    nhr_free(pvVar4);
    pvVar2 = nhr_malloc((size_t)size);
    compr_size = 0;
    pvVar4 = nhr_gz_compress(pvVar2,(size_t)size,&compr_size,'\x01');
    if (pvVar4 == (void *)0x0) {
      __assert_fail("compr_buff",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x88,"int test_gz_big_data(void)");
    }
    if (compr_size == 0) {
      __assert_fail("compr_size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x89,"int test_gz_big_data(void)");
    }
    strings[0] = (char *)0x0;
    pvVar4 = nhr_gz_decompress(pvVar4,compr_size,(size_t *)strings,'\x01');
    if (size != (Elf64_Ehdr *)strings[0]) {
      __assert_fail("src_size == dst_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x8e,"int test_gz_big_data(void)");
    }
    iVar1 = bcmp(pvVar2,pvVar4,(size_t)size);
    if (iVar1 != 0) {
      __assert_fail("memcmp(src, dst, src_size) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x8f,"int test_gz_big_data(void)");
    }
    nhr_free(pvVar2);
    nhr_free(pvVar4);
    size = size + 0x4000;
  }
  pcVar3 = "compr_buff";
  pcVar5 = "int test_gz_big_data(void)";
  __line = 0x77;
LAB_001016a9:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                ,__line,pcVar5);
}

Assistant:

static int test_gz_creation_string(void) {
	const char * strings[STRINGS_COUNT];
	int i;
	const char * src_string;
	size_t src_string_len, compr_size, decompr_size;
	void * compr_buff;
	char * decompr_string;

	strings[0] = test_gz_string1;
	strings[1] = test_gz_string2;
	strings[2] = test_gz_string3;
	strings[3] = test_gz_string4;
	strings[4] = test_gz_string5;
	strings[5] = test_gz_string6;
	strings[6] = test_gz_string7;
	strings[7] = test_gz_string8;

	for (i = 0; i < STRINGS_COUNT; i++) {
		src_string = strings[i];
		src_string_len = strlen(src_string);
		assert(src_string_len > 0);

		compr_size = 0;
		compr_buff = nhr_gz_compress(src_string, src_string_len, &compr_size, NHR_GZ_METHOD_DEFLATE);
		assert(compr_buff);
		assert(compr_size > 0);

		decompr_size = 0;
		decompr_string = (char *)nhr_gz_decompress(compr_buff, compr_size, &decompr_size, NHR_GZ_METHOD_DEFLATE);

		assert(src_string_len == decompr_size);
		assert(strncmp(src_string, decompr_string, decompr_size) == 0);

		nhr_free(compr_buff);
		nhr_free(decompr_string);


		compr_size = 0;
		compr_buff = nhr_gz_compress(src_string, src_string_len, &compr_size, NHR_GZ_METHOD_GZIP);
		assert(compr_buff);
		assert(compr_size > 0);

		decompr_size = 0;
		decompr_string = (char *)nhr_gz_decompress(compr_buff, compr_size, &decompr_size, NHR_GZ_METHOD_GZIP);

		assert(src_string_len == decompr_size);
		assert(strncmp(src_string, decompr_string, decompr_size) == 0);

		nhr_free(compr_buff);
		nhr_free(decompr_string);
	}
	return 0;
}